

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioAppearance.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::RadioAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,RadioAppearance *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Radio:");
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:  ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tState:          ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString RadioAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Radio:"
       << "\n\tFrozen Status:  " << m_FrozenStatus
       << "\n\tState:          " << m_State
       << "\n";

    return ss.str();
}